

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_pic.cpp
# Opt level: O3

void __thiscall
QPicturePaintEngine::writeCmdLength(QPicturePaintEngine *this,int pos,QRectF *r,bool corr)

{
  QPaintEnginePrivate *this_00;
  QPaintEnginePrivate *pQVar1;
  long lVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  qreal qVar6;
  bool bVar7;
  int iVar8;
  undefined8 *puVar9;
  QPainter *pQVar10;
  QPen *this_01;
  QTransform *this_02;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long in_FS_OFFSET;
  int iVar15;
  double dVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar19 [16];
  ulong uVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar25;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  double dStack_b0;
  double dStack_a0;
  QRectF local_98;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QPaintEngine).d_ptr.d;
  iVar8 = QBuffer::pos();
  uVar14 = iVar8 - pos;
  local_78.xp = r->xp;
  local_78.yp = r->yp;
  local_78.w = r->w;
  local_78.h = r->h;
  if ((int)uVar14 < 0xff) {
    QBuffer::seek(*(long *)&pQVar1[1].systemRect + 8);
    QDataStream::operator<<((QDataStream *)(pQVar1 + 1),(int)(char)uVar14);
  }
  else {
    this_00 = pQVar1 + 1;
    QDataStream::operator<<((QDataStream *)this_00,0);
    QBuffer::seek(*(long *)&pQVar1[1].systemRect + 8);
    QDataStream::operator<<((QDataStream *)this_00,0xffffffff);
    puVar9 = (undefined8 *)QBuffer::buffer();
    if (((int *)*puVar9 == (int *)0x0) || (1 < *(int *)*puVar9)) {
      QByteArray::reallocData((longlong)puVar9,(AllocationOption)puVar9[2]);
    }
    memmove((void *)(puVar9[1] + (long)pos + 4),(void *)(puVar9[1] + (long)pos),(ulong)uVar14);
    QDataStream::operator<<((QDataStream *)this_00,uVar14);
  }
  QBuffer::seek(*(long *)&pQVar1[1].systemRect + 8);
  qVar4 = local_78.h;
  qVar3 = local_78.w;
  if ((local_78.w <= 0.0) && (local_78.h <= 0.0)) goto LAB_002a6b95;
  if (corr) {
    pQVar10 = QPaintEngine::painter(&this->super_QPaintEngine);
    this_01 = QPainter::pen(pQVar10);
    iVar8 = QPen::width(this_01);
    dVar16 = (double)(iVar8 / 2);
    dVar23 = qVar3 + local_78.xp;
    dVar25 = qVar4 + local_78.yp;
    local_78.xp = local_78.xp - dVar16;
    local_78.yp = local_78.yp - dVar16;
    local_78.w = (dVar23 + dVar16) - local_78.xp;
    local_78.h = (dVar25 + dVar16) - local_78.yp;
  }
  pQVar10 = QPaintEngine::painter(&this->super_QPaintEngine);
  this_02 = QPainter::transform(pQVar10);
  QTransform::mapRect(&local_58,this_02,&local_78);
  local_78.w = local_58.w;
  local_78.h = local_58.h;
  local_78.xp = local_58.xp;
  local_78.yp = local_58.yp;
  pQVar10 = QPaintEngine::painter(&this->super_QPaintEngine);
  bVar7 = QPainter::hasClipping(pQVar10);
  if (bVar7) {
    local_98.w._0_4_ = 0xffffffff;
    local_98.w._4_4_ = 0xffffffff;
    local_98.h._0_4_ = 0xffffffff;
    local_98.h._4_4_ = 0xffffffff;
    local_98.xp._0_4_ = 0xffffffff;
    local_98.xp._4_4_ = 0xffffffff;
    local_98.yp._0_4_ = 0xffffffff;
    local_98.yp._4_4_ = 0xffffffff;
    pQVar10 = QPaintEngine::painter(&this->super_QPaintEngine);
    QPainter::clipBoundingRect(&local_98,pQVar10);
    QRectF::operator&(&local_58,&local_78);
    local_78.w = local_58.w;
    local_78.h = local_58.h;
    local_78.xp = local_58.xp;
    local_78.yp = local_58.yp;
  }
  qVar6 = local_78.h;
  qVar5 = local_78.w;
  qVar4 = local_78.yp;
  qVar3 = local_78.xp;
  if ((local_78.w <= 0.0) && (local_78.h <= 0.0)) goto LAB_002a6b95;
  auVar18._8_8_ = local_78.yp;
  auVar18._0_8_ = local_78.xp;
  auVar18 = minpd(_DAT_00674790,auVar18);
  auVar18 = maxpd(auVar18,_DAT_006747a0);
  dVar16 = floor(auVar18._0_8_);
  dStack_a0 = auVar18._8_8_;
  dVar23 = floor(dStack_a0);
  iVar15 = (int)dVar16;
  iVar20 = (int)dVar23;
  auVar22._0_8_ = qVar5 + qVar3;
  auVar22._8_8_ = qVar6 + qVar4;
  auVar18 = minpd(_DAT_00674790,auVar22);
  auVar18 = maxpd(auVar18,_DAT_006747a0);
  dVar16 = ceil(auVar18._0_8_);
  dStack_b0 = auVar18._8_8_;
  dVar23 = ceil(dStack_b0);
  auVar19._0_4_ = (int)dVar16;
  auVar19._4_4_ = (int)dVar23;
  auVar19._8_8_ = 0;
  lVar2 = *(long *)&pQVar1[1].systemRect;
  iVar8 = *(int *)(lVar2 + 0x28);
  iVar11 = *(int *)(lVar2 + 0x30) + 1;
  if (iVar11 - iVar8 < 1) {
    iVar13 = *(int *)(lVar2 + 0x2c);
    iVar12 = *(int *)(lVar2 + 0x34) + 1;
    if (0 < iVar12 - iVar13) goto LAB_002a6b3f;
    uVar17 = CONCAT44(auVar19._4_4_ + -1,auVar19._0_4_ + -1);
    uVar21 = CONCAT44(iVar20,iVar15);
  }
  else {
    iVar13 = *(int *)(lVar2 + 0x2c);
    iVar12 = *(int *)(lVar2 + 0x34) + 1;
LAB_002a6b3f:
    uVar21 = CONCAT44(-(uint)(iVar13 < iVar20),-(uint)(iVar8 < iVar15));
    uVar21 = ~uVar21 & CONCAT44(iVar20,iVar15) | CONCAT44(iVar13,iVar8) & uVar21;
    auVar24._0_8_ = CONCAT44(-(uint)(auVar19._4_4_ < iVar12),-(uint)(auVar19._0_4_ < iVar11));
    auVar24._8_8_ = 0;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = CONCAT44(iVar12,iVar11) & auVar24._0_8_;
    auVar26 = ~auVar24 & auVar19 | auVar26;
    uVar17 = CONCAT44(auVar26._4_4_ + -1,auVar26._0_4_ + -1);
  }
  *(ulong *)(lVar2 + 0x28) = uVar21;
  *(undefined8 *)(lVar2 + 0x30) = uVar17;
LAB_002a6b95:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPicturePaintEngine::writeCmdLength(int pos, const QRectF &r, bool corr)
{
    Q_D(QPicturePaintEngine);
    int newpos = d->pic_d->pictb.pos();            // new position
    int length = newpos - pos;
    QRectF br(r);

    if (length < 255) {                         // write 8-bit length
        d->pic_d->pictb.seek(pos - 1);             // position to right index
        d->s << (quint8)length;
    } else {                                    // write 32-bit length
        d->s << (quint32)0;                    // extend the buffer
        d->pic_d->pictb.seek(pos - 1);             // position to right index
        d->s << (quint8)255;                   // indicate 32-bit length
        char *p = d->pic_d->pictb.buffer().data();
        memmove(p+pos+4, p+pos, length);        // make room for 4 byte
        d->s << (quint32)length;
        newpos += 4;
    }
    d->pic_d->pictb.seek(newpos);                  // set to new position

    if (br.width() > 0.0 || br.height() > 0.0) {
        if (corr) {                             // widen bounding rect
            int w2 = painter()->pen().width() / 2;
            br.setCoords(br.left() - w2, br.top() - w2,
                         br.right() + w2, br.bottom() + w2);
        }
        br = painter()->transform().mapRect(br);
        if (painter()->hasClipping()) {
            QRectF cr = painter()->clipBoundingRect();
            br &= cr;
        }

        if (br.width() > 0.0 || br.height() > 0.0) {
            const auto clampToIntRange = [](qreal v)
            {
                return qBound(qreal((std::numeric_limits<int>::min)()),
                              v,
                              qreal((std::numeric_limits<int>::max)()));
            };
            int minx = qFloor(clampToIntRange(br.left()));
            int miny = qFloor(clampToIntRange(br.top()));
            int maxx = qCeil(clampToIntRange(br.right()));
            int maxy = qCeil(clampToIntRange(br.bottom()));

            if (d->pic_d->brect.width() > 0 || d->pic_d->brect.height() > 0) {
                minx = qMin(minx, d->pic_d->brect.left());
                miny = qMin(miny, d->pic_d->brect.top());
                maxx = qMax(maxx, d->pic_d->brect.x() + d->pic_d->brect.width());
                maxy = qMax(maxy, d->pic_d->brect.y() + d->pic_d->brect.height());
                d->pic_d->brect.setCoords(minx, miny, maxx - 1, maxy - 1);
            } else {
                d->pic_d->brect.setCoords(minx, miny, maxx - 1, maxy - 1);
            }
        }
    }
}